

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  Expr *local_30;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  
  MakeUnique<wabt::TryExpr>();
  SetBlockDeclaration(this,(BlockDeclaration *)&local_30[1].loc.filename.size_,sig_type);
  local_28._M_head_impl = local_30;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if (local_28._M_head_impl != (Expr *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar1.enum_ != Error) {
    PushLabel(this,Try,(ExprList *)&local_30[3].loc.filename.size_,local_30);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = MakeUnique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  PushLabel(LabelType::Try, expr_list, expr);
  return Result::Ok;
}